

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateBaseClass.cpp
# Opt level: O2

void __thiscall
vkt::DynamicState::DynamicStateBaseClass::DynamicStateBaseClass
          (DynamicStateBaseClass *this,Context *context,char *vertexShaderName,
          char *fragmentShaderName)

{
  DeviceInterface *pDVar1;
  allocator<char> local_32;
  allocator<char> local_31;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR__DynamicStateBaseClass_00bd5a60
  ;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  pDVar1 = Context::getDeviceInterface(context);
  this->m_vk = pDVar1;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_colorTargetImage).m_ptr = (Image *)0x0;
  (this->m_colorTargetImage).m_state = (SharedPtrStateBase *)0x0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = 0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  Draw::PipelineCreateInfo::VertexInputState::VertexInputState
            (&this->m_vertexInputState,0,(VkVertexInputBindingDescription *)0x0,0,
             (VkVertexInputAttributeDescription *)0x0);
  memset(&this->m_vertexBuffer,0,0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_vertexShaderName,vertexShaderName,&local_31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_fragmentShaderName,fragmentShaderName,&local_32);
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_data).
  super__Vector_base<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

DynamicStateBaseClass::DynamicStateBaseClass (Context& context, const char* vertexShaderName, const char* fragmentShaderName)
	: TestInstance				(context)
	, m_colorAttachmentFormat   (vk::VK_FORMAT_R8G8B8A8_UNORM)
	, m_topology				(vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)
	, m_vk						(context.getDeviceInterface())
	, m_vertexShaderName		(vertexShaderName)
	, m_fragmentShaderName		(fragmentShaderName)
{
}